

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool cppcms::xss::validate(char *begin,char *end,rules *r)

{
  pointer peVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t dummy_count;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string enc;
  string temp_input;
  
  rules::encoding_abi_cxx11_(&enc,r);
  dummy_count = 0;
  temp_input._M_dataplus._M_p = (pointer)&temp_input.field_2;
  temp_input._M_string_length = 0;
  temp_input.field_2._M_local_buf[0] = '\0';
  if (enc._M_string_length != 0) {
    bVar2 = encoding::is_ascii_compatible(&enc);
    if (bVar2) {
      bVar2 = encoding::valid(&enc,begin,end,&dummy_count);
    }
    else {
      booster::locale::conv::to_utf<char>((char *)&parsed,begin,(string *)end,(method_type)&enc);
      std::__cxx11::string::swap((string *)&temp_input);
      begin = (char *)temp_input._M_dataplus;
      end = temp_input._M_dataplus._M_p + temp_input._M_string_length;
      std::__cxx11::string::~string((string *)&parsed);
      bVar2 = encoding::valid("UTF-8",begin,end,&dummy_count);
    }
    if (bVar2 == false) {
      bVar2 = false;
      goto LAB_00246301;
    }
  }
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_8::split_to_parts(begin,end,&parsed);
  peVar1 = parsed.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)parsed.
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)parsed.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  uVar6 = 0;
  do {
    uVar5 = (ulong)uVar6;
    if (uVar4 <= uVar5) {
      anon_unknown_8::validate_nesting(&parsed,((r->d).ptr_)->is_xhtml);
      uVar6 = 0;
      goto LAB_002462a6;
    }
    if (peVar1[uVar5].type == invalid_data) break;
    anon_unknown_8::parse_part(peVar1 + uVar5);
    uVar6 = uVar6 + 1;
  } while (peVar1[uVar5].type != invalid_data);
  goto LAB_002462bb;
  while( true ) {
    bVar3 = anon_unknown_8::validate_entry_by_rules(peVar1 + uVar5,r);
    uVar6 = uVar6 + 1;
    if (!bVar3) break;
LAB_002462cc:
    uVar5 = (ulong)uVar6;
    bVar2 = uVar4 <= uVar5;
    if (uVar4 <= uVar5) break;
  }
  goto LAB_002462bd;
  while (uVar6 = uVar6 + 1, peVar1[uVar5].type != invalid_data) {
LAB_002462a6:
    uVar5 = (ulong)uVar6;
    if (uVar4 <= uVar5) {
      uVar6 = 0;
      goto LAB_002462cc;
    }
  }
LAB_002462bb:
  bVar2 = false;
LAB_002462bd:
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(&parsed);
LAB_00246301:
  std::__cxx11::string::~string((string *)&temp_input);
  std::__cxx11::string::~string((string *)&enc);
  return bVar2;
}

Assistant:

bool validate(char const *begin,char const *end,rules const &r)
	{
		std::string enc = r.encoding();
		size_t dummy_count = 0;
		
		std::string temp_input;

		if(!enc.empty()) {
			if(encoding::is_ascii_compatible(enc)) {
				if(!encoding::valid(enc,begin,end,dummy_count))
					return false;
			}
			else {
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,end,enc,booster::locale::conv::stop);
					temp_input.swap(tmp);
					begin = temp_input.c_str();
					end = begin + temp_input.size();
				}
				catch(...) {
					return false;
				}
				if(!encoding::valid("UTF-8",begin,end,dummy_count))
					return false;
			}
		}
		
		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				return false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				return false;
		}
		
		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				return false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r))
				return false;
		}

		return true;

	}